

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  uint uVar3;
  pointer addr;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  int *in_stack_fffffffffffffee0;
  long local_108;
  uint local_100 [2];
  string local_f8 [4];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  addr = (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
         super__Vector_impl_data._M_start;
  uVar3 = 0;
  if (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      bVar1 = AddSingle(this,addr,source,time_penalty);
      local_100[0] = uVar3 + bVar1;
      addr = addr + 1;
      uVar3 = local_100[0];
    } while (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
    if (local_100[0] == 0) {
      uVar3 = 0;
    }
    else {
      pLVar2 = LogInstance();
      bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar2,ADDRMAN,Debug);
      uVar3 = 1;
      if (bVar1) {
        local_108 = ((long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        CNetAddr::ToStringAddr_abi_cxx11_(local_f8,source);
        pLVar2 = LogInstance();
        bVar1 = BCLog::Logger::Enabled(pLVar2);
        if (bVar1) {
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          tinyformat::format<int,unsigned_long,std::__cxx11::string,int,int>
                    (&local_78,
                     (tinyformat *)"Added %i addresses (of %i) from %s: %i tried, %i new\n",
                     (char *)local_100,(int *)&local_108,(unsigned_long *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->nTried,&this->nNew,in_stack_fffffffffffffee0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_58,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          pLVar2 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x54;
          local_78._M_string_length = 0xf955a8;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
          ;
          source_file._M_len = 0x54;
          str._M_str = local_58._M_dataplus._M_p;
          str._M_len = local_58._M_string_length;
          logging_function._M_str = "Add_";
          logging_function._M_len = 4;
          BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x2b0,ADDRMAN,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        uVar3 = (uint)(0 < (int)local_100[0]);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SUB41(uVar3,0);
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}